

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void AGSSock::Terminate(void)

{
  Pool *pPVar1;
  
  pPVar1 = pool;
  if (pool != (Pool *)0x0) {
    Pool::~Pool(pool);
  }
  operator_delete(pPVar1,0x90);
  pool = (Pool *)0x0;
  return;
}

Assistant:

void Terminate()
{
	// We assume that all managed objects will be disposed of at this point.
	// That means the pool is or soon will be empty thus the read loop stops.
	// Deleting the pool gives it two seconds to do it nicely or else just
	// kills it.
	
	delete pool;
	pool = nullptr;
}